

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O0

void __thiscall FCanvasTexture::FCanvasTexture(FCanvasTexture *this,char *name,int width,int height)

{
  WORD local_20;
  WORD local_1c;
  int height_local;
  int width_local;
  char *name_local;
  FCanvasTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FCanvasTexture_00a08068;
  FString::operator=(&(this->super_FTexture).Name,name);
  local_1c = (WORD)width;
  (this->super_FTexture).Width = local_1c;
  local_20 = (WORD)height;
  (this->super_FTexture).Height = local_20;
  (this->super_FTexture).TopOffset = 0;
  (this->super_FTexture).LeftOffset = 0;
  FTexture::CalcBitSize(&this->super_FTexture);
  *(ushort *)&(this->super_FTexture).field_0x31 =
       *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7;
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = local_20;
  this->DummySpans[1].TopOffset = 0;
  this->DummySpans[1].Length = 0;
  (this->super_FTexture).UseType = '\x01';
  this->Canvas = (DSimpleCanvas *)0x0;
  this->bNeedsUpdate = true;
  this->bDidUpdate = false;
  *(ushort *)&(this->super_FTexture).field_0x31 =
       *(ushort *)&(this->super_FTexture).field_0x31 & 0xffdf | 0x20;
  this->bFirstUpdate = true;
  this->bPixelsAllocated = false;
  return;
}

Assistant:

FCanvasTexture::FCanvasTexture (const char *name, int width, int height)
{
	Name = name;
	Width = width;
	Height = height;
	LeftOffset = TopOffset = 0;
	CalcBitSize ();

	bMasked = false;
	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
	UseType = TEX_Wall;
	Canvas = NULL;
	bNeedsUpdate = true;
	bDidUpdate = false;
	bHasCanvas = true;
	bFirstUpdate = true;
	bPixelsAllocated = false;
}